

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  char *pcVar2;
  char **local_40d0;
  char *cmd;
  char sbuf [16384];
  Output local_c0 [3];
  undefined1 local_a8 [8];
  UCIAdapter adapter;
  Clunk engine;
  char **param_1_local;
  int param_0_local;
  
  clunk::Clunk::Clunk((Clunk *)&adapter.field_0x50);
  senjo::UCIAdapter::UCIAdapter((UCIAdapter *)local_a8);
  bVar1 = senjo::UCIAdapter::Start((UCIAdapter *)local_a8,(ChessEngine *)&adapter.field_0x50);
  if (bVar1) {
    memset(&cmd,0,0x4000);
    do {
      pcVar2 = fgets((char *)&cmd,0x4000,_stdin);
      if (pcVar2 == (char *)0x0) break;
      local_40d0 = &cmd;
      senjo::NormalizeString((char **)&local_40d0);
      bVar1 = senjo::UCIAdapter::DoCommand((UCIAdapter *)local_a8,(char *)local_40d0);
    } while (bVar1);
    param_1_local._4_4_ = 0;
  }
  else {
    senjo::Output::Output(local_c0,InfoPrefix);
    senjo::Output::operator<<(local_c0,(char (*) [27])"Unable to start UCIAdapter");
    senjo::Output::~Output(local_c0);
    param_1_local._4_4_ = 1;
  }
  sbuf[0x3ffc] = '\x01';
  sbuf[0x3ffd] = '\0';
  sbuf[0x3ffe] = '\0';
  sbuf[0x3fff] = '\0';
  senjo::UCIAdapter::~UCIAdapter((UCIAdapter *)local_a8);
  clunk::Clunk::~Clunk((Clunk *)&adapter.field_0x50);
  return param_1_local._4_4_;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
  Clunk engine;
  senjo::UCIAdapter adapter;

  if (!adapter.Start(engine)) {
    senjo::Output() << "Unable to start UCIAdapter";
    return 1;
  }

  char sbuf[16384];
  memset(sbuf, 0, sizeof(sbuf));

  while (fgets(sbuf, sizeof(sbuf), stdin)) {
    char* cmd = sbuf;
    senjo::NormalizeString(cmd);
    if (!adapter.DoCommand(cmd)) {
      break;
    }
  }

  return 0;
}